

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Base64.cpp
# Opt level: O0

bool Jupiter_isBase64_s(char *in,size_t inLen)

{
  char cVar1;
  char *end;
  size_t inLen_local;
  char *in_local;
  
  if ((inLen & 3) == 0) {
    inLen_local = (size_t)in;
    do {
      if ((char *)inLen_local == in + inLen) {
        return true;
      }
      cVar1 = *(char *)inLen_local;
      inLen_local = inLen_local + 1;
    } while ("BBBBBBBBB@BBBBBBBBBBBBBBBBBBBBBBBBBBBBBBBBB>BBB?456789:;<=BBBABBB"[cVar1] != 'B');
  }
  return false;
}

Assistant:

bool Jupiter_isBase64_s(const char *in, size_t inLen)
{
	if (inLen % 4 != 0)
	{
		return false;
	}
	const char *end = in + inLen;
	while (in != end)
	{
		switch (Jupiter_base64DecodeTable[*in++])
		{
		case 66:
			return false;
		default:
			break;
		}
	}
	return true;
}